

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

string * __thiscall
cfd::core::
JsonObjectVector<cfd::api::json::ElementsDecodeRawTransactionTxIn,ElementsDecodeRawTransactionTxInStruct>
::Serialize_abi_cxx11_
          (JsonObjectVector<cfd::api::json::ElementsDecodeRawTransactionTxIn,_ElementsDecodeRawTransactionTxInStruct>
           *this)

{
  bool bVar1;
  reference pbVar2;
  value_type *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *item_1;
  iterator __end3;
  iterator __begin3;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  bool is_first;
  string item;
  ElementsDecodeRawTransactionTxIn *element;
  const_iterator __end0;
  const_iterator __begin0;
  JsonObjectVector<cfd::api::json::ElementsDecodeRawTransactionTxIn,_ElementsDecodeRawTransactionTxInStruct>
  *__range3;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str_list;
  string *result;
  string *__lhs;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff60;
  _Self local_98;
  _Self local_90;
  undefined1 *local_88;
  byte local_7d;
  string local_70 [32];
  reference local_50;
  ElementsDecodeRawTransactionTxIn *local_48;
  __normal_iterator<const_cfd::api::json::ElementsDecodeRawTransactionTxIn_*,_std::vector<cfd::api::json::ElementsDecodeRawTransactionTxIn,_std::allocator<cfd::api::json::ElementsDecodeRawTransactionTxIn>_>_>
  local_40 [2];
  undefined1 local_30 [31];
  byte local_11;
  
  local_11 = 0;
  __lhs = in_RDI;
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x49006a);
  local_40[0]._M_current =
       (ElementsDecodeRawTransactionTxIn *)
       std::
       vector<cfd::api::json::ElementsDecodeRawTransactionTxIn,_std::allocator<cfd::api::json::ElementsDecodeRawTransactionTxIn>_>
       ::begin((vector<cfd::api::json::ElementsDecodeRawTransactionTxIn,_std::allocator<cfd::api::json::ElementsDecodeRawTransactionTxIn>_>
                *)in_RDI);
  local_48 = (ElementsDecodeRawTransactionTxIn *)
             std::
             vector<cfd::api::json::ElementsDecodeRawTransactionTxIn,_std::allocator<cfd::api::json::ElementsDecodeRawTransactionTxIn>_>
             ::end((vector<cfd::api::json::ElementsDecodeRawTransactionTxIn,_std::allocator<cfd::api::json::ElementsDecodeRawTransactionTxIn>_>
                    *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_cfd::api::json::ElementsDecodeRawTransactionTxIn_*,_std::vector<cfd::api::json::ElementsDecodeRawTransactionTxIn,_std::allocator<cfd::api::json::ElementsDecodeRawTransactionTxIn>_>_>
                        *)__lhs,(__normal_iterator<const_cfd::api::json::ElementsDecodeRawTransactionTxIn_*,_std::vector<cfd::api::json::ElementsDecodeRawTransactionTxIn,_std::allocator<cfd::api::json::ElementsDecodeRawTransactionTxIn>_>_>
                                 *)in_RDI);
    if (!bVar1) break;
    local_50 = __gnu_cxx::
               __normal_iterator<const_cfd::api::json::ElementsDecodeRawTransactionTxIn_*,_std::vector<cfd::api::json::ElementsDecodeRawTransactionTxIn,_std::allocator<cfd::api::json::ElementsDecodeRawTransactionTxIn>_>_>
               ::operator*(local_40);
    (*(local_50->super_JsonClassBase<cfd::api::json::ElementsDecodeRawTransactionTxIn>).
      _vptr_JsonClassBase[6])(local_70);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_ffffffffffffff60,in_RSI);
    std::__cxx11::string::~string(local_70);
    __gnu_cxx::
    __normal_iterator<const_cfd::api::json::ElementsDecodeRawTransactionTxIn_*,_std::vector<cfd::api::json::ElementsDecodeRawTransactionTxIn,_std::allocator<cfd::api::json::ElementsDecodeRawTransactionTxIn>_>_>
    ::operator++(local_40);
  }
  std::__cxx11::string::operator=(in_RDI,"[");
  local_7d = 1;
  local_88 = local_30;
  local_90._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_RDI);
  local_98._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_RDI);
  while( true ) {
    bVar1 = std::operator!=(&local_90,&local_98);
    if (!bVar1) break;
    pbVar2 = std::
             _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x490197);
    if ((local_7d & 1) == 0) {
      std::__cxx11::string::operator+=(in_RDI,",");
    }
    std::__cxx11::string::operator+=(in_RDI,(string *)pbVar2);
    local_7d = 0;
    std::
    _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_90);
  }
  std::__cxx11::string::operator+=(in_RDI,"]");
  local_11 = 1;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x4901ff);
  if ((local_11 & 1) == 0) {
    std::__cxx11::string::~string(in_RDI);
  }
  return __lhs;
}

Assistant:

virtual std::string Serialize() const {
    std::string result;
    std::list<std::string> str_list;
    for (auto& element : *this) {
      std::string item = element.Serialize();
      str_list.push_back(item);
    }

    result = "[";
    bool is_first = true;
    for (const auto& item : str_list) {
      if (!is_first) {
        result += ",";
      }
      result += item;
      is_first = false;
    }
    result += "]";

    return result;
  }